

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::VectorShuffleFeedingShuffle::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *param_3)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint uVar1;
  Op OVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  DefUseManager *this_00;
  TypeManager *this_01;
  Type *pTVar7;
  undefined4 extraout_var;
  Instruction *pIVar8;
  undefined4 extraout_var_00;
  Type *type_00;
  Constant *c;
  undefined4 extraout_var_01;
  size_type sVar9;
  reference pvVar10;
  uint *puVar11;
  Operand *pOVar12;
  uint local_1c4;
  uint32_t operand;
  uint32_t i;
  int32_t adjustment;
  uint32_t new_op0_size;
  Type *new_feeder_type;
  Instruction *new_feeder_inst;
  Constant *local_190;
  Constant *null_const;
  Type *type;
  ConstantManager *const_mgr;
  iterator local_170;
  undefined8 local_168;
  SmallVector<unsigned_int,_2UL> local_160;
  Operand local_138;
  undefined4 local_104;
  uint32_t local_100;
  uint local_fc;
  uint32_t component_index;
  uint32_t op;
  uint32_t undef_literal;
  undefined8 local_e8;
  SmallVector<unsigned_int,_2UL> local_e0;
  Operand local_b8;
  undefined1 local_88 [8];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> new_operands;
  uint32_t new_feeder_id;
  uint32_t feeder_op0_length;
  Vector *feeder_op0_type;
  Instruction *feeder2;
  bool feeder_is_op0;
  uint32_t op0_length;
  Vector *op0_type;
  Instruction *feeding_shuffle_inst;
  TypeManager *type_mgr;
  DefUseManager *def_use_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_3_local;
  Instruction *inst_local;
  IRContext *context_local;
  anon_class_1_0_00000001 *this_local;
  
  OVar2 = Instruction::opcode(inst);
  if (OVar2 != OpVectorShuffle) {
    __assert_fail("inst->opcode() == spv::Op::OpVectorShuffle && \"Wrong opcode.  Should be OpVectorShuffle.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0xa54,
                  "auto spvtools::opt::(anonymous namespace)::VectorShuffleFeedingShuffle()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  this_00 = IRContext::get_def_use_mgr(context);
  this_01 = IRContext::get_type_mgr(context);
  uVar3 = Instruction::GetSingleWordInOperand(inst,0);
  op0_type = (Vector *)analysis::DefUseManager::GetDef(this_00,uVar3);
  uVar3 = Instruction::type_id((Instruction *)op0_type);
  pTVar7 = analysis::TypeManager::GetType(this_01,uVar3);
  iVar4 = (*pTVar7->_vptr_Type[0xd])();
  uVar3 = analysis::Vector::element_count((Vector *)CONCAT44(extraout_var,iVar4));
  OVar2 = Instruction::opcode((Instruction *)op0_type);
  if (OVar2 != OpVectorShuffle) {
    uVar5 = Instruction::GetSingleWordInOperand(inst,1);
    op0_type = (Vector *)analysis::DefUseManager::GetDef(this_00,uVar5);
  }
  feeder2._3_1_ = OVar2 == OpVectorShuffle;
  OVar2 = Instruction::opcode((Instruction *)op0_type);
  if (OVar2 == OpVectorShuffle) {
    uVar5 = Instruction::GetSingleWordInOperand((Instruction *)op0_type,0);
    pIVar8 = analysis::DefUseManager::GetDef(this_00,uVar5);
    uVar5 = Instruction::type_id(pIVar8);
    pTVar7 = analysis::TypeManager::GetType(this_01,uVar5);
    iVar4 = (*pTVar7->_vptr_Type[0xd])();
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         analysis::Vector::element_count((Vector *)CONCAT44(extraout_var_00,iVar4));
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_88);
    op = 0;
    _undef_literal = &op;
    local_e8 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = _undef_literal;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e0,init_list_00);
    Operand::Operand(&local_b8,SPV_OPERAND_TYPE_ID,&local_e0);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::resize
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_88,2
               ,&local_b8);
    Operand::~Operand(&local_b8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e0);
    component_index = 0xffffffff;
    for (local_fc = 2; uVar1 = local_fc, uVar5 = Instruction::NumInOperands(inst), uVar1 < uVar5;
        local_fc = local_fc + 1) {
      local_100 = Instruction::GetSingleWordInOperand(inst,local_fc);
      if ((local_100 != 0xffffffff) && (feeder2._3_1_ == local_100 < uVar3)) {
        if (uVar3 <= local_100) {
          local_100 = local_100 - uVar3;
        }
        local_100 = Instruction::GetSingleWordInOperand((Instruction *)op0_type,local_100 + 2);
        uVar5 = (uint32_t)
                new_operands.
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_100 <
            new_operands.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
          if ((uint32_t)
              new_operands.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
            new_operands.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 Instruction::GetSingleWordInOperand((Instruction *)op0_type,0);
          }
          else {
            uVar6 = Instruction::GetSingleWordInOperand((Instruction *)op0_type,0);
            if (uVar5 != uVar6) {
              this_local._7_1_ = false;
              goto LAB_0038c2fd;
            }
          }
        }
        else if (local_100 != 0xffffffff) {
          if ((uint32_t)
              new_operands.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
            new_operands.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                 Instruction::GetSingleWordInOperand((Instruction *)op0_type,1);
          }
          else {
            uVar6 = Instruction::GetSingleWordInOperand((Instruction *)op0_type,1);
            if (uVar5 != uVar6) {
              this_local._7_1_ = false;
              goto LAB_0038c2fd;
            }
          }
          local_100 = local_100 -
                      new_operands.
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        }
        if ((!feeder2._3_1_) && (local_100 != 0xffffffff)) {
          local_100 = uVar3 + local_100;
        }
      }
      const_mgr._4_4_ = local_100;
      local_170 = (iterator)((long)&const_mgr + 4);
      local_168 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_170;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_160,init_list);
      Operand::Operand(&local_138,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_160);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_88
                 ,&local_138);
      Operand::~Operand(&local_138);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_160);
    }
    if ((uint32_t)
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage == 0) {
      type = (Type *)IRContext::get_constant_mgr(context);
      uVar5 = Instruction::type_id((Instruction *)op0_type);
      type_00 = analysis::TypeManager::GetType(this_01,uVar5);
      pTVar7 = type;
      null_const = (Constant *)type_00;
      memset(&new_feeder_inst,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_feeder_inst);
      c = analysis::ConstantManager::GetConstant
                    ((ConstantManager *)pTVar7,type_00,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_feeder_inst);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_feeder_inst);
      local_190 = c;
      pIVar8 = analysis::ConstantManager::GetDefiningInstruction
                         ((ConstantManager *)type,c,0,(inst_iterator *)0x0);
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = Instruction::result_id(pIVar8);
    }
    uVar5 = (uint32_t)
            new_operands.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (feeder2._3_1_) {
      pIVar8 = analysis::DefUseManager::GetDef
                         (this_00,(uint32_t)
                                  new_operands.
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar5 = Instruction::type_id(pIVar8);
      pTVar7 = analysis::TypeManager::GetType(this_01,uVar5);
      iVar4 = (*pTVar7->_vptr_Type[0xd])();
      uVar5 = analysis::Vector::element_count((Vector *)CONCAT44(extraout_var_01,iVar4));
      if (uVar3 - uVar5 != 0) {
        for (local_1c4 = 2;
            sVar9 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                    size((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                         local_88), local_1c4 < sVar9; local_1c4 = local_1c4 + 1) {
          uVar6 = Instruction::GetSingleWordInOperand(inst,local_1c4);
          if ((uVar3 <= uVar6) && (uVar6 != 0xffffffff)) {
            pvVar10 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                      operator[]((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  *)local_88,(ulong)local_1c4);
            puVar11 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pvVar10->words,0);
            *puVar11 = *puVar11 - (uVar3 - uVar5);
          }
        }
      }
      uVar3 = (uint32_t)
              new_operands.
              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar10 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                operator[]((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            *)local_88,0);
      puVar11 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pvVar10->words,0);
      *puVar11 = uVar3;
      pOVar12 = Instruction::GetInOperand(inst,1);
      pvVar10 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                operator[]((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            *)local_88,1);
      Operand::operator=(pvVar10,pOVar12);
    }
    else {
      pvVar10 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                operator[]((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            *)local_88,1);
      puVar11 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pvVar10->words,0);
      *puVar11 = uVar5;
      pOVar12 = Instruction::GetInOperand(inst,0);
      pvVar10 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                operator[]((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            *)local_88,0);
      Operand::operator=(pvVar10,pOVar12);
    }
    Instruction::SetInOperands(inst,(OperandList *)local_88);
    this_local._7_1_ = true;
LAB_0038c2fd:
    local_104 = 1;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_88);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

FoldingRule VectorShuffleFeedingShuffle() {
  return [](IRContext* context, Instruction* inst,
            const std::vector<const analysis::Constant*>&) {
    assert(inst->opcode() == spv::Op::OpVectorShuffle &&
           "Wrong opcode.  Should be OpVectorShuffle.");

    analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();
    analysis::TypeManager* type_mgr = context->get_type_mgr();

    Instruction* feeding_shuffle_inst =
        def_use_mgr->GetDef(inst->GetSingleWordInOperand(0));
    analysis::Vector* op0_type =
        type_mgr->GetType(feeding_shuffle_inst->type_id())->AsVector();
    uint32_t op0_length = op0_type->element_count();

    bool feeder_is_op0 = true;
    if (feeding_shuffle_inst->opcode() != spv::Op::OpVectorShuffle) {
      feeding_shuffle_inst =
          def_use_mgr->GetDef(inst->GetSingleWordInOperand(1));
      feeder_is_op0 = false;
    }

    if (feeding_shuffle_inst->opcode() != spv::Op::OpVectorShuffle) {
      return false;
    }

    Instruction* feeder2 =
        def_use_mgr->GetDef(feeding_shuffle_inst->GetSingleWordInOperand(0));
    analysis::Vector* feeder_op0_type =
        type_mgr->GetType(feeder2->type_id())->AsVector();
    uint32_t feeder_op0_length = feeder_op0_type->element_count();

    uint32_t new_feeder_id = 0;
    std::vector<Operand> new_operands;
    new_operands.resize(
        2, {SPV_OPERAND_TYPE_ID, {0}});  // Place holders for vector operands.
    const uint32_t undef_literal = 0xffffffff;
    for (uint32_t op = 2; op < inst->NumInOperands(); ++op) {
      uint32_t component_index = inst->GetSingleWordInOperand(op);

      // Do not interpret the undefined value literal as coming from operand 1.
      if (component_index != undef_literal &&
          feeder_is_op0 == (component_index < op0_length)) {
        // This component comes from the feeding_shuffle_inst.  Update
        // |component_index| to be the index into the operand of the feeder.

        // Adjust component_index to get the index into the operands of the
        // feeding_shuffle_inst.
        if (component_index >= op0_length) {
          component_index -= op0_length;
        }
        component_index =
            feeding_shuffle_inst->GetSingleWordInOperand(component_index + 2);

        // Check if we are using a component from the first or second operand of
        // the feeding instruction.
        if (component_index < feeder_op0_length) {
          if (new_feeder_id == 0) {
            // First time through, save the id of the operand the element comes
            // from.
            new_feeder_id = feeding_shuffle_inst->GetSingleWordInOperand(0);
          } else if (new_feeder_id !=
                     feeding_shuffle_inst->GetSingleWordInOperand(0)) {
            // We need both elements of the feeding_shuffle_inst, so we cannot
            // fold.
            return false;
          }
        } else if (component_index != undef_literal) {
          if (new_feeder_id == 0) {
            // First time through, save the id of the operand the element comes
            // from.
            new_feeder_id = feeding_shuffle_inst->GetSingleWordInOperand(1);
          } else if (new_feeder_id !=
                     feeding_shuffle_inst->GetSingleWordInOperand(1)) {
            // We need both elements of the feeding_shuffle_inst, so we cannot
            // fold.
            return false;
          }
          component_index -= feeder_op0_length;
        }

        if (!feeder_is_op0 && component_index != undef_literal) {
          component_index += op0_length;
        }
      }
      new_operands.push_back(
          {SPV_OPERAND_TYPE_LITERAL_INTEGER, {component_index}});
    }

    if (new_feeder_id == 0) {
      analysis::ConstantManager* const_mgr = context->get_constant_mgr();
      const analysis::Type* type =
          type_mgr->GetType(feeding_shuffle_inst->type_id());
      const analysis::Constant* null_const = const_mgr->GetConstant(type, {});
      new_feeder_id =
          const_mgr->GetDefiningInstruction(null_const, 0)->result_id();
    }

    if (feeder_is_op0) {
      // If the size of the first vector operand changed then the indices
      // referring to the second operand need to be adjusted.
      Instruction* new_feeder_inst = def_use_mgr->GetDef(new_feeder_id);
      analysis::Type* new_feeder_type =
          type_mgr->GetType(new_feeder_inst->type_id());
      uint32_t new_op0_size = new_feeder_type->AsVector()->element_count();
      int32_t adjustment = op0_length - new_op0_size;

      if (adjustment != 0) {
        for (uint32_t i = 2; i < new_operands.size(); i++) {
          uint32_t operand = inst->GetSingleWordInOperand(i);
          if (operand >= op0_length && operand != undef_literal) {
            new_operands[i].words[0] -= adjustment;
          }
        }
      }

      new_operands[0].words[0] = new_feeder_id;
      new_operands[1] = inst->GetInOperand(1);
    } else {
      new_operands[1].words[0] = new_feeder_id;
      new_operands[0] = inst->GetInOperand(0);
    }

    inst->SetInOperands(std::move(new_operands));
    return true;
  };
}